

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

bool M_Responder(event_t *ev)

{
  BYTE BVar1;
  byte bVar2;
  BYTE BVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  FName *menu;
  uint uVar8;
  bool bVar9;
  FName local_30;
  FName local_2c;
  
  if (chatmodeon != 0) {
    return false;
  }
  if (menuactive == MENU_Off || DMenu::CurrentMenu == (DMenu *)0x0) {
    if (!MenuEnabled) {
      return false;
    }
    if (ev->type == '\x04') {
      if (ev->subtype != '\a') {
        return false;
      }
      if (ConsoleState == c_down) {
        return false;
      }
      if (m_use_mouse.Value == 0) {
        return false;
      }
      M_StartControlPanel(true);
      menu = &local_30;
    }
    else {
      if (ev->type != '\x01') {
        return false;
      }
      if (ev->data1 != 1) {
        if (ev->data1 != 0x3b) {
          return false;
        }
        if (devparm) {
          G_ScreenShot((char *)0x0);
          return true;
        }
        return false;
      }
      M_StartControlPanel(true);
      menu = &local_2c;
    }
    menu->Index = 0x1d5;
    M_SetMenu(menu,-1);
    return true;
  }
  BVar1 = ev->type;
  if (BVar1 == '\x04') {
    bVar2 = ev->subtype;
    uVar8 = 7;
    iVar5 = 7;
    if (bVar2 < 3) {
      if (bVar2 != 1) {
        if (bVar2 == 2) {
          return true;
        }
LAB_003364d4:
        if (((byte)(bVar2 - 5) < 0x14) && (m_use_mouse.Value == 0)) {
          return true;
        }
        goto LAB_003364e7;
      }
    }
    else if (bVar2 != 3) {
      iVar6 = 0;
      if (bVar2 != 0x14) {
        if (bVar2 == 0x15) goto LAB_003367d3;
        goto LAB_003364d4;
      }
      goto LAB_003367eb;
    }
    iVar6 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xc])();
    if ((char)iVar6 == '\0') goto LAB_003365cc;
    sVar4 = ev->data1;
    BVar3 = ev->subtype;
    switch(sVar4) {
    case 1:
      iVar6 = 1;
      iVar5 = 5;
      if (BVar3 == '\x03') goto LAB_003367d3;
      goto LAB_003366f1;
    case 2:
      iVar6 = 2;
      iVar5 = 4;
      if (BVar3 == '\x03') goto LAB_003367d3;
      goto LAB_0033677b;
    case 3:
    case 4:
    case 7:
    case 9:
    case 0xc:
switchD_0033652e_caseD_3:
      bVar9 = true;
      if (BVar3 != '\x03') {
LAB_003364e7:
        iVar5 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])(DMenu::CurrentMenu,ev);
        return SUB41(iVar5,0);
      }
      goto switchD_0033644b_caseD_1a0;
    case 5:
      iVar6 = 5;
      iVar5 = 2;
      if (BVar3 == '\x03') goto LAB_003367d3;
      goto LAB_0033664c;
    case 6:
      iVar6 = 6;
      iVar5 = 3;
      if (BVar3 == '\x03') goto LAB_003367d3;
      goto LAB_00336669;
    case 8:
      uVar8 = 8;
      iVar5 = 8;
      if (BVar3 == '\x03') {
        iVar6 = 8;
        goto LAB_003367d3;
      }
      bVar9 = false;
      iVar6 = 8;
      goto LAB_003367ed;
    case 10:
      iVar6 = 10;
      iVar5 = 1;
      if (BVar3 == '\x03') goto LAB_003367d3;
      break;
    case 0xb:
      bVar9 = true;
      uVar8 = 0;
      iVar6 = 0xb;
      if (BVar3 != '\x03') goto LAB_003367ed;
      goto LAB_00336634;
    case 0xd:
      iVar6 = 0xd;
      iVar5 = 6;
      if (BVar3 == '\x03') goto LAB_003367d3;
      goto LAB_00336764;
    default:
      if (sVar4 == 0x1e) {
        iVar6 = 0x1e;
      }
      else {
        if (sVar4 != 0x1b) goto switchD_0033652e_caseD_3;
        iVar6 = 0x1b;
      }
      if (BVar3 == '\x03') goto LAB_003367d3;
      goto LAB_003367eb;
    }
    goto LAB_00336686;
  }
  if (1 < (byte)(BVar1 - 1) || menuactive == MENU_WaitKey) {
LAB_003365cc:
    bVar9 = false;
switchD_0033644b_caseD_1a0:
    iVar5 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])(DMenu::CurrentMenu,ev);
    return (bool)(bVar9 ^ 1U | (byte)iVar5);
  }
  bVar9 = BVar1 == '\x02';
  sVar4 = ev->data1;
  iVar6 = (int)sVar4;
  switch(sVar4) {
  case 0x19c:
  case 0x1ae:
  case 0x1b5:
    goto switchD_0033644b_caseD_19c;
  case 0x19d:
  case 0x1af:
  case 0x1b4:
switchD_0033644b_caseD_19d:
    bVar9 = true;
    uVar8 = 0;
    if (BVar1 != '\x02') goto LAB_003367ed;
LAB_00336634:
    iVar5 = 0;
    goto LAB_003367d3;
  case 0x19e:
  case 0x1ac:
  case 0x1b7:
switchD_0033644b_caseD_19e:
    iVar5 = 3;
    if (BVar1 == '\x02') goto LAB_003367d3;
LAB_00336669:
    bVar9 = true;
    uVar8 = 3;
    goto LAB_003367ed;
  case 0x19f:
  case 0x1ad:
  case 0x1b6:
switchD_0033644b_caseD_19f:
    iVar5 = 2;
    if (BVar1 == '\x02') goto LAB_003367d3;
LAB_0033664c:
    bVar9 = true;
    uVar8 = 2;
    goto LAB_003367ed;
  case 0x1a0:
  case 0x1a1:
  case 0x1a2:
  case 0x1a3:
  case 0x1a4:
  case 0x1a5:
  case 0x1a6:
  case 0x1a7:
  case 0x1a8:
  case 0x1a9:
  case 0x1aa:
  case 0x1ab:
  case 0x1b0:
  case 0x1b1:
  case 0x1b2:
  case 0x1b3:
  case 0x1b8:
  case 0x1b9:
  case 0x1ba:
  case 0x1bb:
  case 0x1be:
  case 0x1bf:
    goto switchD_0033644b_caseD_1a0;
  case 0x1bc:
switchD_0033644b_caseD_1bc:
    iVar5 = 4;
    if (BVar1 == '\x02') goto LAB_003367d3;
LAB_0033677b:
    bVar9 = true;
    uVar8 = 4;
    goto LAB_003367ed;
  case 0x1bd:
switchD_0033644b_caseD_1bd:
    iVar5 = 5;
    if (BVar1 == '\x02') goto LAB_003367d3;
LAB_003366f1:
    bVar9 = true;
    uVar8 = 5;
    goto LAB_003367ed;
  case 0x1c0:
switchD_0033644b_caseD_1c0:
    iVar5 = 6;
    if (BVar1 == '\x02') goto LAB_003367d3;
LAB_00336764:
    uVar8 = 6;
    break;
  case 0x1c1:
switchD_0033644b_caseD_1c1:
    iVar5 = 7;
    if (BVar1 == '\x02') goto LAB_003367d3;
    uVar8 = 7;
    break;
  case 0x1c2:
switchD_0033644b_caseD_1c2:
    iVar5 = 8;
    if (BVar1 == '\x02') goto LAB_003367d3;
    uVar8 = 8;
    break;
  default:
    switch(sVar4) {
    case 0x108:
      goto switchD_0033644b_caseD_1c0;
    case 0x109:
      goto switchD_0033644b_caseD_1c1;
    case 0x10a:
      goto switchD_0033644b_caseD_1c2;
    case 0x10b:
      goto switchD_0033644b_caseD_1a0;
    case 0x10c:
      goto switchD_0033644b_caseD_1bc;
    case 0x10d:
      goto switchD_0033644b_caseD_1bd;
    default:
      switch(sVar4) {
      case 0x188:
        goto switchD_0033644b_caseD_19d;
      case 0x189:
        goto switchD_0033644b_caseD_19e;
      case 0x18a:
        goto switchD_0033644b_caseD_19c;
      case 0x18b:
        goto switchD_0033644b_caseD_19f;
      default:
        goto switchD_0033644b_caseD_1a0;
      }
    }
  }
LAB_003367eb:
  bVar9 = false;
LAB_003367ed:
  FButtonStatus::PressKey((FButtonStatus *)((long)MenuButtons[0].Keys + (ulong)(uVar8 << 4)),iVar6);
  uVar7 = (ulong)uVar8;
  MenuButtonOrigin[uVar7] = BVar1 != '\x04';
  if (bVar9) {
    MenuButtonTickers[uVar7] = 0xe;
  }
  (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[8])
            (DMenu::CurrentMenu,uVar7,(ulong)(BVar1 != '\x04'));
  return true;
switchD_0033644b_caseD_19c:
  iVar5 = 1;
  if (BVar1 == '\x02') {
LAB_003367d3:
    FButtonStatus::ReleaseKey
              ((FButtonStatus *)((long)MenuButtons[0].Keys + (ulong)(uint)(iVar5 << 4)),iVar6);
    return false;
  }
LAB_00336686:
  bVar9 = true;
  uVar8 = 1;
  goto LAB_003367ed;
}

Assistant:

bool M_Responder (event_t *ev) 
{ 
	int ch = 0;
	bool keyup = false;
	int mkey = NUM_MKEYS;
	bool fromcontroller = true;

	if (chatmodeon)
	{
		return false;
	}

	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		// There are a few input sources we are interested in:
		//
		// EV_KeyDown / EV_KeyUp : joysticks/gamepads/controllers
		// EV_GUI_KeyDown / EV_GUI_KeyUp : the keyboard
		// EV_GUI_Char : printable characters, which we want in string input mode
		//
		// This code previously listened for EV_GUI_KeyRepeat to handle repeating
		// in the menus, but that doesn't work with gamepads, so now we combine
		// the multiple inputs into buttons and handle the repetition manually.
		if (ev->type == EV_GUI_Event)
		{
			fromcontroller = false;
			if (ev->subtype == EV_GUI_KeyRepeat)
			{
				// We do our own key repeat handling but still want to eat the
				// OS's repeated keys.
				return true;
			}
			else if (ev->subtype == EV_GUI_BackButtonDown || ev->subtype == EV_GUI_BackButtonUp)
			{
				mkey = MKEY_Back;
				keyup = ev->subtype == EV_GUI_BackButtonUp;
			}
			else if (ev->subtype != EV_GUI_KeyDown && ev->subtype != EV_GUI_KeyUp)
			{
				// do we want mouse input?
				if (ev->subtype >= EV_GUI_FirstMouseEvent && ev->subtype <= EV_GUI_LastMouseEvent)
				{
						if (!m_use_mouse)
							return true;
				}

				// pass everything else on to the current menu
				return DMenu::CurrentMenu->Responder(ev);
			}
			else if (DMenu::CurrentMenu->TranslateKeyboardEvents())
			{
				ch = ev->data1;
				keyup = ev->subtype == EV_GUI_KeyUp;
				switch (ch)
				{
				case GK_BACK:			mkey = MKEY_Back;		break;
				case GK_ESCAPE:			mkey = MKEY_Back;		break;
				case GK_RETURN:			mkey = MKEY_Enter;		break;
				case GK_UP:				mkey = MKEY_Up;			break;
				case GK_DOWN:			mkey = MKEY_Down;		break;
				case GK_LEFT:			mkey = MKEY_Left;		break;
				case GK_RIGHT:			mkey = MKEY_Right;		break;
				case GK_BACKSPACE:		mkey = MKEY_Clear;		break;
				case GK_PGUP:			mkey = MKEY_PageUp;		break;
				case GK_PGDN:			mkey = MKEY_PageDown;	break;
				default:
					if (!keyup)
					{
						return DMenu::CurrentMenu->Responder(ev);
					}
					break;
				}
			}
		}
		else if (menuactive != MENU_WaitKey && (ev->type == EV_KeyDown || ev->type == EV_KeyUp))
		{
			keyup = ev->type == EV_KeyUp;

			ch = ev->data1;
			switch (ch)
			{
			case KEY_JOY1:
			case KEY_PAD_A:
				mkey = MKEY_Enter;
				break;

			case KEY_JOY2:
			case KEY_PAD_B:
				mkey = MKEY_Back;
				break;

			case KEY_JOY3:
			case KEY_PAD_X:
				mkey = MKEY_Clear;
				break;

			case KEY_JOY5:
			case KEY_PAD_LSHOULDER:
				mkey = MKEY_PageUp;
				break;

			case KEY_JOY6:
			case KEY_PAD_RSHOULDER:
				mkey = MKEY_PageDown;
				break;

			case KEY_PAD_DPAD_UP:
			case KEY_PAD_LTHUMB_UP:
			case KEY_JOYAXIS1MINUS:
			case KEY_JOYPOV1_UP:
				mkey = MKEY_Up;
				break;

			case KEY_PAD_DPAD_DOWN:
			case KEY_PAD_LTHUMB_DOWN:
			case KEY_JOYAXIS1PLUS:
			case KEY_JOYPOV1_DOWN:
				mkey = MKEY_Down;
				break;

			case KEY_PAD_DPAD_LEFT:
			case KEY_PAD_LTHUMB_LEFT:
			case KEY_JOYAXIS2MINUS:
			case KEY_JOYPOV1_LEFT:
				mkey = MKEY_Left;
				break;

			case KEY_PAD_DPAD_RIGHT:
			case KEY_PAD_LTHUMB_RIGHT:
			case KEY_JOYAXIS2PLUS:
			case KEY_JOYPOV1_RIGHT:
				mkey = MKEY_Right;
				break;
			}
		}

		if (mkey != NUM_MKEYS)
		{
			if (keyup)
			{
				MenuButtons[mkey].ReleaseKey(ch);
				return false;
			}
			else
			{
				MenuButtons[mkey].PressKey(ch);
				MenuButtonOrigin[mkey] = fromcontroller;
				if (mkey <= MKEY_PageDown)
				{
					MenuButtonTickers[mkey] = KEY_REPEAT_DELAY;
				}
				DMenu::CurrentMenu->MenuEvent(mkey, fromcontroller);
				return true;
			}
		}
		return DMenu::CurrentMenu->Responder(ev) || !keyup;
	}
	else if (MenuEnabled)
	{
		if (ev->type == EV_KeyDown)
		{
			// Pop-up menu?
			if (ev->data1 == KEY_ESCAPE)
			{
				M_StartControlPanel(true);
				M_SetMenu(NAME_Mainmenu, -1);
				return true;
			}
			// If devparm is set, pressing F1 always takes a screenshot no matter
			// what it's bound to. (for those who don't bother to read the docs)
			if (devparm && ev->data1 == KEY_F1)
			{
				G_ScreenShot(NULL);
				return true;
			}
			return false;
		}
		else if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_LButtonDown && 
				 ConsoleState != c_down && m_use_mouse)
		{
			M_StartControlPanel(true);
			M_SetMenu(NAME_Mainmenu, -1);
			return true;
		}
	}
	return false;
}